

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

void __thiscall spvtools::opt::analysis::TypeManager::AnalyzeTypes(TypeManager *this,Module *module)

{
  mapped_type mVar1;
  Instruction *this_00;
  Type *pTVar2;
  IRContext *this_01;
  mapped_type pTVar3;
  _Hash_node_base *p_Var4;
  void *pvVar5;
  undefined8 *puVar6;
  TypeManager *pTVar7;
  char cVar8;
  uint32_t uVar9;
  int iVar10;
  mapped_type *ppIVar11;
  Type *pTVar12;
  undefined4 extraout_var;
  long lVar13;
  mapped_type *ppTVar14;
  pointer pUVar15;
  undefined4 extraout_var_00;
  mapped_type *pmVar16;
  UnresolvedType *type_1;
  pointer pUVar17;
  undefined8 *puVar18;
  _Hash_node_base *p_Var19;
  UnresolvedType *type_2;
  pointer pUVar20;
  TypeManager *pTVar21;
  TypeManager *pTVar22;
  _Hash_node_base *p_Var23;
  UnresolvedType *type;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true,_true>,_bool>
  pVar24;
  __hashtable *__h;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decorations;
  key_type local_88;
  key_type local_80;
  undefined1 local_78 [16];
  _Link_type local_68;
  _Base_ptr local_60;
  __node_base local_58;
  size_type local_50;
  pointer local_48;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  _Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_38;
  
  Module::GetConstants
            ((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
              *)local_78,module);
  puVar18 = (undefined8 *)CONCAT44(local_78._4_4_,local_78._0_4_);
  puVar6 = (undefined8 *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (puVar18 != puVar6) {
    do {
      this_00 = (Instruction *)*puVar18;
      uVar9 = 0;
      if (this_00->has_result_id_ == true) {
        uVar9 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
      }
      local_88 = (key_type)CONCAT44(local_88._4_4_,uVar9);
      ppIVar11 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_to_constant_inst_,(key_type *)&local_88);
      *ppIVar11 = this_00;
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar6);
    puVar18 = (undefined8 *)CONCAT44(local_78._4_4_,local_78._0_4_);
  }
  if (puVar18 != (undefined8 *)0x0) {
    operator_delete(puVar18,(long)local_68 - (long)puVar18);
  }
  pTVar21 = (TypeManager *)local_78;
  Module::GetTypes((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                    *)pTVar21,module);
  pTVar22 = (TypeManager *)CONCAT44(local_78._4_4_,local_78._0_4_);
  pTVar7 = (TypeManager *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (pTVar22 != pTVar7) {
    do {
      pTVar21 = this;
      RecordIfTypeDefinition
                (this,(Instruction *)
                      (((_Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                         *)&pTVar22->consumer_)->_M_impl).super__Vector_impl_data._M_start);
      pTVar22 = (TypeManager *)&pTVar22->context_;
    } while (pTVar22 != pTVar7);
    pTVar22 = (TypeManager *)CONCAT44(local_78._4_4_,local_78._0_4_);
  }
  if (pTVar22 != (TypeManager *)0x0) {
    operator_delete(pTVar22,(long)local_68 - (long)pTVar22);
    pTVar21 = pTVar22;
  }
  pUVar17 = (this->incomplete_types_).
            super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pUVar15 = (this->incomplete_types_).
            super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar17 != pUVar15) {
    do {
      if (((pUVar17->type_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl)->kind_ ==
          kForwardPointer) {
        pTVar12 = GetType(this,pUVar17->id_);
        if (pTVar12 == (Type *)0x0) {
          __assert_fail("t",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                        ,0x5a,
                        "void spvtools::opt::analysis::TypeManager::AnalyzeTypes(const Module &)");
        }
        iVar10 = (*pTVar12->_vptr_Type[0x21])(pTVar12);
        if (CONCAT44(extraout_var,iVar10) == 0) {
          __assert_fail("p",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                        ,0x5c,
                        "void spvtools::opt::analysis::TypeManager::AnalyzeTypes(const Module &)");
        }
        pTVar21 = (TypeManager *)
                  (pUVar17->type_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
        lVar13 = (**(code **)(*(long *)&((_Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                                          *)&pTVar21->consumer_)->_M_impl + 0x178))();
        *(long *)(lVar13 + 0x30) = CONCAT44(extraout_var,iVar10);
      }
      pUVar17 = pUVar17 + 1;
    } while (pUVar17 != pUVar15);
    pUVar17 = (this->incomplete_types_).
              super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pUVar15 = (this->incomplete_types_).
              super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pUVar17 != pUVar15) {
      do {
        ReplaceForwardPointers
                  (pTVar21,(pUVar17->type_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                           _M_head_impl);
        pUVar17 = pUVar17 + 1;
      } while (pUVar17 != pUVar15);
      pUVar15 = (this->incomplete_types_).
                super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pUVar17 = (this->incomplete_types_).
                super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pUVar15 != pUVar17) {
        do {
          pTVar12 = (pUVar15->type_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
          if (pTVar12->kind_ == kForwardPointer) {
            (pUVar15->type_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
                 (Type *)0x0;
            (*pTVar12->_vptr_Type[1])();
          }
          pUVar15 = pUVar15 + 1;
        } while (pUVar15 != pUVar17);
        pUVar17 = (this->incomplete_types_).
                  super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    local_40 = &(this->id_to_incomplete_type_)._M_h;
    pUVar15 = pUVar17;
    do {
      pUVar20 = (this->incomplete_types_).
                super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pUVar20 == pUVar15) goto LAB_00542f29;
      local_80 = (key_type)((ulong)local_80 & 0xffffffff00000000);
      local_48 = pUVar20;
      do {
        pTVar12 = (local_48->type_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
        pUVar20 = local_48 + 1;
        local_48 = pUVar20;
        if ((pTVar12 != (Type *)0x0) && (pUVar20 != pUVar15)) {
          do {
            pTVar2 = (pUVar20->type_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
            if (pTVar2 != (Type *)0x0) {
              local_78._8_4_ = _S_red;
              local_68 = (_Link_type)0x0;
              local_60 = (_Base_ptr)(local_78 + 8);
              local_50 = 0;
              local_58._M_nxt = (_Hash_node_base *)local_60;
              iVar10 = (*pTVar12->_vptr_Type[2])
                                 (pTVar12,pTVar2,
                                  (_Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
                                   *)local_78);
              std::
              _Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
              ::_M_erase((_Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
                          *)local_78,local_68);
              if ((char)iVar10 != '\0') {
                ReplaceType(this,pTVar12,pTVar2);
                pTVar2 = (pUVar20->type_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl
                ;
                (pUVar20->type_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl =
                     (Type *)0x0;
                if (pTVar2 != (Type *)0x0) {
                  (*pTVar2->_vptr_Type[1])();
                }
                local_78._0_4_ = pUVar20->id_;
                ppTVar14 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_40,(key_type *)local_78);
                *ppTVar14 = pTVar12;
                local_80 = (key_type)
                           CONCAT44(local_80._4_4_,(int)CONCAT71((int7)((ulong)ppTVar14 >> 8),1));
              }
            }
            pUVar15 = pUVar20 + 1;
            pUVar17 = pUVar15;
            pUVar20 = pUVar15;
          } while (pUVar15 !=
                   (this->incomplete_types_).
                   super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
      } while (local_48 != pUVar15);
      pUVar15 = local_48;
    } while (((ulong)local_80 & 1) != 0);
    pUVar20 = (this->incomplete_types_).
              super__Vector_base<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_00542f29:
    if (pUVar20 != pUVar17) {
      local_80 = (key_type)&this->type_pool_;
      local_48 = (pointer)&this->id_to_type_;
      local_38 = (_Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&this->type_to_id_;
      do {
        pTVar12 = (pUVar20->type_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>._M_head_impl;
        if ((pTVar12 != (Type *)0x0) &&
           (iVar10 = (*pTVar12->_vptr_Type[0x2f])(), CONCAT44(extraout_var_00,iVar10) == 0)) {
          this_01 = this->context_;
          if ((this_01->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
            IRContext::BuildDecorationManager(this_01);
          }
          pTVar21 = (TypeManager *)local_78;
          DecorationManager::GetDecorationsFor
                    ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)pTVar21,
                     (this_01->decoration_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                     _M_head_impl,pUVar20->id_,true);
          puVar6 = (undefined8 *)CONCAT44(local_78._12_4_,local_78._8_4_);
          for (puVar18 = (undefined8 *)CONCAT44(local_78._4_4_,local_78._0_4_); puVar18 != puVar6;
              puVar18 = puVar18 + 1) {
            AttachDecoration(pTVar21,(Instruction *)*puVar18,
                             (pUVar20->type_)._M_t.
                             super___uniq_ptr_impl<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::analysis::Type_*,_std::default_delete<spvtools::opt::analysis::Type>_>
                             .super__Head_base<0UL,_spvtools::opt::analysis::Type_*,_false>.
                             _M_head_impl);
          }
          local_88 = local_80;
          pVar24 = std::
                   _Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,true>>>>
                             ((_Hashtable<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,std::default_delete<spvtools::opt::analysis::Type>>>,std::__detail::_Identity,spvtools::opt::analysis::CompareTypeUniquePointers,spvtools::opt::analysis::HashTypeUniquePointer,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)local_80,&pUVar20->type_,&local_88);
          pTVar3 = *(mapped_type *)
                    ((long)pVar24.first.
                           super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                           ._M_cur.
                           super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                    + 8);
          local_88 = (key_type)CONCAT44(local_88._4_4_,pUVar20->id_);
          ppTVar14 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_48,(key_type *)&local_88);
          *ppTVar14 = pTVar3;
          mVar1 = pUVar20->id_;
          local_88 = *(key_type *)
                      ((long)pVar24.first.
                             super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_true>
                      + 8);
          pmVar16 = std::__detail::
                    _Map_base<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_38,&local_88);
          *pmVar16 = mVar1;
          local_88 = (key_type)CONCAT44(local_88._4_4_,pUVar20->id_);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(local_40,&local_88);
          pvVar5 = (void *)CONCAT44(local_78._4_4_,local_78._0_4_);
          if (pvVar5 != (void *)0x0) {
            operator_delete(pvVar5,(long)local_68 - (long)pvVar5);
          }
        }
        pUVar20 = pUVar20 + 1;
      } while (pUVar20 != pUVar17);
    }
    p_Var19 = (this->id_to_incomplete_type_)._M_h._M_before_begin._M_nxt;
    if (p_Var19 != (_Hash_node_base *)0x0) {
      do {
        pTVar3 = (mapped_type)p_Var19[2]._M_nxt;
        ppTVar14 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->id_to_type_,(key_type *)(p_Var19 + 1));
        *ppTVar14 = pTVar3;
        p_Var19 = p_Var19->_M_nxt;
      } while (p_Var19 != (_Hash_node_base *)0x0);
    }
    p_Var19 = (this->type_pool_)._M_h._M_before_begin._M_nxt;
    if (p_Var19 != (_Hash_node_base *)0x0) {
      do {
        for (p_Var23 = (this->type_pool_)._M_h._M_before_begin._M_nxt;
            p_Var23 != (_Hash_node_base *)0x0; p_Var23 = p_Var23->_M_nxt) {
          p_Var4 = p_Var19[1]._M_nxt;
          if (p_Var4 != p_Var23[1]._M_nxt) {
            local_78._8_4_ = _S_red;
            local_68 = (_Link_type)0x0;
            local_60 = (_Base_ptr)(local_78 + 8);
            local_50 = 0;
            local_58._M_nxt = (_Hash_node_base *)local_60;
            cVar8 = (*(code *)p_Var4->_M_nxt[2]._M_nxt)
                              (p_Var4,p_Var23[1]._M_nxt,
                               (_Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
                                *)local_78);
            std::
            _Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
            ::_M_erase((_Rb_tree<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>,_std::_Identity<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::less<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_std::allocator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>_>
                        *)local_78,local_68);
            if (cVar8 != '\0') {
              __assert_fail("(ti == tj || !ti->IsSame(tj)) && \"Type pool contains two types that are the same.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                            ,0xac,
                            "void spvtools::opt::analysis::TypeManager::AnalyzeTypes(const Module &)"
                           );
            }
          }
        }
        p_Var19 = p_Var19->_M_nxt;
      } while (p_Var19 != (_Hash_node_base *)0x0);
    }
  }
  return;
}

Assistant:

void TypeManager::AnalyzeTypes(const Module& module) {
  // First pass through the constants, as some will be needed when traversing
  // the types in the next pass.
  for (const auto* inst : module.GetConstants()) {
    id_to_constant_inst_[inst->result_id()] = inst;
  }

  // Then pass through the types.  Any types that reference a forward pointer
  // (directly or indirectly) are incomplete, and are added to incomplete types.
  for (const auto* inst : module.GetTypes()) {
    RecordIfTypeDefinition(*inst);
  }

  if (incomplete_types_.empty()) {
    return;
  }

  // Get the real pointer definition for all of the forward pointers.
  for (auto& type : incomplete_types_) {
    if (type.type()->kind() == Type::kForwardPointer) {
      auto* t = GetType(type.id());
      assert(t);
      auto* p = t->AsPointer();
      assert(p);
      type.type()->AsForwardPointer()->SetTargetPointer(p);
    }
  }

  // Replaces the references to the forward pointers in the incomplete types.
  for (auto& type : incomplete_types_) {
    ReplaceForwardPointers(type.type());
  }

  // Delete the forward pointers now that they are not referenced anymore.
  for (auto& type : incomplete_types_) {
    if (type.type()->kind() == Type::kForwardPointer) {
      type.ResetType(nullptr);
    }
  }

  // Compare the complete types looking for types that are the same.  If there
  // are two types that are the same, then replace one with the other.
  // Continue until we reach a fixed point.
  bool restart = true;
  while (restart) {
    restart = false;
    for (auto it1 = incomplete_types_.begin(); it1 != incomplete_types_.end();
         ++it1) {
      uint32_t id1 = it1->id();
      Type* type1 = it1->type();
      if (!type1) {
        continue;
      }

      for (auto it2 = it1 + 1; it2 != incomplete_types_.end(); ++it2) {
        uint32_t id2 = it2->id();
        (void)(id2 + id1);
        Type* type2 = it2->type();
        if (!type2) {
          continue;
        }

        if (type1->IsSame(type2)) {
          ReplaceType(type1, type2);
          it2->ResetType(nullptr);
          id_to_incomplete_type_[it2->id()] = type1;
          restart = true;
        }
      }
    }
  }

  // Add the remaining incomplete types to the type pool.
  for (auto& type : incomplete_types_) {
    if (type.type() && !type.type()->AsForwardPointer()) {
      std::vector<Instruction*> decorations =
          context()->get_decoration_mgr()->GetDecorationsFor(type.id(), true);
      for (auto dec : decorations) {
        AttachDecoration(*dec, type.type());
      }
      auto pair = type_pool_.insert(type.ReleaseType());
      id_to_type_[type.id()] = pair.first->get();
      type_to_id_[pair.first->get()] = type.id();
      id_to_incomplete_type_.erase(type.id());
    }
  }

  // Add a mapping for any ids that whose original type was replaced by an
  // equivalent type.
  for (auto& type : id_to_incomplete_type_) {
    id_to_type_[type.first] = type.second;
  }

#ifndef NDEBUG
  // Check if the type pool contains two types that are the same.  This
  // is an indication that the hashing and comparison are wrong.  It
  // will cause a problem if the type pool gets resized and everything
  // is rehashed.
  for (auto& i : type_pool_) {
    for (auto& j : type_pool_) {
      Type* ti = i.get();
      Type* tj = j.get();
      assert((ti == tj || !ti->IsSame(tj)) &&
             "Type pool contains two types that are the same.");
    }
  }
#endif
}